

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlDocPtr xmlSAXParseFileWithData(xmlSAXHandlerPtr sax,char *filename,int recovery,void *data)

{
  xmlParserCtxtPtr ctxt_00;
  xmlParserInputPtr local_48;
  xmlParserInputPtr input;
  xmlParserCtxtPtr ctxt;
  xmlDocPtr ret;
  void *data_local;
  int recovery_local;
  char *filename_local;
  xmlSAXHandlerPtr sax_local;
  
  ctxt = (xmlParserCtxtPtr)0x0;
  ctxt_00 = xmlNewSAXParserCtxt(sax,(void *)0x0);
  if (ctxt_00 == (xmlParserCtxtPtr)0x0) {
    sax_local = (xmlSAXHandlerPtr)0x0;
  }
  else {
    if (data != (void *)0x0) {
      ctxt_00->_private = data;
    }
    if (recovery != 0) {
      ctxt_00->options = ctxt_00->options | 1;
      ctxt_00->recovery = 1;
    }
    if (((filename == (char *)0x0) || (*filename != '-')) || (filename[1] != '\0')) {
      local_48 = xmlCtxtNewInputFromUrl(ctxt_00,filename,(char *)0x0,(char *)0x0,0);
    }
    else {
      local_48 = xmlCtxtNewInputFromFd(ctxt_00,filename,0,(char *)0x0,0);
    }
    if (local_48 != (xmlParserInputPtr)0x0) {
      ctxt = (xmlParserCtxtPtr)xmlCtxtParseDocument(ctxt_00,local_48);
    }
    xmlFreeParserCtxt(ctxt_00);
    sax_local = (xmlSAXHandlerPtr)ctxt;
  }
  return (xmlDocPtr)sax_local;
}

Assistant:

xmlDocPtr
xmlSAXParseFileWithData(xmlSAXHandlerPtr sax, const char *filename,
                        int recovery, void *data) {
    xmlDocPtr ret = NULL;
    xmlParserCtxtPtr ctxt;
    xmlParserInputPtr input;

    ctxt = xmlNewSAXParserCtxt(sax, NULL);
    if (ctxt == NULL)
	return(NULL);

    if (data != NULL)
	ctxt->_private = data;

    if (recovery) {
        ctxt->options |= XML_PARSE_RECOVER;
        ctxt->recovery = 1;
    }

    if ((filename != NULL) && (filename[0] == '-') && (filename[1] == 0))
        input = xmlCtxtNewInputFromFd(ctxt, filename, STDIN_FILENO, NULL, 0);
    else
        input = xmlCtxtNewInputFromUrl(ctxt, filename, NULL, NULL, 0);

    if (input != NULL)
        ret = xmlCtxtParseDocument(ctxt, input);

    xmlFreeParserCtxt(ctxt);
    return(ret);
}